

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddRef.c
# Opt level: O1

int cuddTimesInDeathRow(DdManager *dd,DdNode *f)

{
  int iVar1;
  long lVar2;
  
  if (0 < (long)dd->deathRowDepth) {
    lVar2 = 0;
    iVar1 = 0;
    do {
      iVar1 = iVar1 + (uint)(dd->deathRow[lVar2] == f);
      lVar2 = lVar2 + 1;
    } while (dd->deathRowDepth != lVar2);
    return iVar1;
  }
  return 0;
}

Assistant:

int
cuddTimesInDeathRow(
  DdManager *dd,
  DdNode *f)
{
    int count = 0;
#ifndef DD_NO_DEATH_ROW
    int i;

    for (i = 0; i < dd->deathRowDepth; i++) {
        count += f == dd->deathRow[i];
    }
#endif

    return(count);

}